

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule_list.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
openjij::utility::GenerateGeometricBetaSchedule<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double beta_min,
          double beta_max,int32_t num_sweeps)

{
  pointer pdVar1;
  ulong uVar2;
  double dVar3;
  initializer_list<double> __l;
  allocator_type local_2a;
  allocator_type local_29;
  double local_28;
  double local_20;
  double local_18;
  
  if (num_sweeps == 1) {
    __l._M_len = 1;
    __l._M_array = &local_18;
    local_18 = beta_min;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_29);
  }
  else {
    local_28 = beta_min;
    local_20 = beta_max;
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,(long)num_sweeps,&local_2a);
    dVar3 = pow(local_20 / local_28,1.0 / (double)(num_sweeps + -1));
    if (0 < num_sweeps) {
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar2 = 0;
      do {
        pdVar1[uVar2] = local_28;
        local_28 = local_28 * dVar3;
        uVar2 = uVar2 + 1;
      } while ((uint)num_sweeps != uVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FloatType> GenerateGeometricBetaSchedule(const FloatType beta_min, const FloatType beta_max, const std::int32_t num_sweeps) {
   if (num_sweeps == 1) {
      return std::vector<FloatType>{beta_min};
   }
   std::vector<FloatType> beta_list(num_sweeps);
   const FloatType alpha = std::pow(beta_max/beta_min, 1/static_cast<FloatType>(num_sweeps - 1));
   FloatType beta = beta_min;
   for (std::int32_t i = 0; i < num_sweeps; ++i) {
      beta_list[i] = beta;
      beta = beta*alpha;
   }
   return beta_list;
}